

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::uniformfv_incompatible_type
               (NegativeTestContext *ctx)

{
  undefined *puVar1;
  int location;
  GLint GVar2;
  deUint64 dVar3;
  deUint32 dVar4;
  RenderContext *renderCtx;
  TestLog *this;
  MessageBuilder *this_00;
  reference pvVar5;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<float> local_3e1;
  undefined1 local_3e0 [8];
  vector<float,_std::allocator<float>_> data;
  string local_3c0;
  MessageBuilder local_3a0;
  int local_21c;
  GLint local_218;
  GLint sampler_f;
  GLint uvec4_f;
  GLint ivec4_f;
  GLint vec4_v;
  allocator<char> local_1d1;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)ctx;
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = uniformTestVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,puVar1,&local_1d1);
  puVar1 = uniformTestFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vec4_v,puVar1,(allocator<char> *)((long)&ivec4_f + 3));
  glu::makeVtxFragSources(&local_1b0,&local_1d0,(string *)&vec4_v);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&vec4_v);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ivec4_f + 3));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  dVar3 = program.m_program.m_info.linkTimeUs;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar3,dVar4);
  dVar3 = program.m_program.m_info.linkTimeUs;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  uvec4_f = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)dVar3,dVar4,"vec4_v");
  dVar3 = program.m_program.m_info.linkTimeUs;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  sampler_f = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)dVar3,dVar4,"ivec4_f");
  dVar3 = program.m_program.m_info.linkTimeUs;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  local_218 = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)dVar3,dVar4,"uvec4_f");
  dVar3 = program.m_program.m_info.linkTimeUs;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  local_21c = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)dVar3,dVar4,"sampler_f");
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  if ((((uvec4_f == -1) || (sampler_f == -1)) || (local_218 == -1)) || (local_21c == -1)) {
    this = glu::CallLogWrapper::getLog((CallLogWrapper *)program.m_program.m_info.linkTimeUs);
    tcu::TestLog::operator<<(&local_3a0,this,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_3a0,(char (*) [46])"// ERROR: Failed to retrieve uniform location");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3a0);
    dVar3 = program.m_program.m_info.linkTimeUs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"Failed to retrieve uniform location",
               (allocator<char> *)
               ((long)&data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    NegativeTestContext::fail((NegativeTestContext *)dVar3,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::allocator<float>::allocator(&local_3e1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_3e0,4,&local_3e1);
  std::allocator<float>::~allocator(&local_3e1);
  dVar3 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,
             "GL_INVALID_OPERATION is generated if the size of the uniform variable declared in the shader does not match the size indicated by the ctx.glUniform command."
             ,&local_409);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar3,&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  dVar3 = program.m_program.m_info.linkTimeUs;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar3,dVar4);
  dVar3 = program.m_program.m_info.linkTimeUs;
  GVar2 = uvec4_f;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3e0,0);
  glu::CallLogWrapper::glUniform1fv((CallLogWrapper *)dVar3,GVar2,1,pvVar5);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar3 = program.m_program.m_info.linkTimeUs;
  GVar2 = uvec4_f;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3e0,0);
  glu::CallLogWrapper::glUniform2fv((CallLogWrapper *)dVar3,GVar2,1,pvVar5);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar3 = program.m_program.m_info.linkTimeUs;
  GVar2 = uvec4_f;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3e0,0);
  glu::CallLogWrapper::glUniform3fv((CallLogWrapper *)dVar3,GVar2,1,pvVar5);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar3 = program.m_program.m_info.linkTimeUs;
  GVar2 = uvec4_f;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3e0,0);
  glu::CallLogWrapper::glUniform4fv((CallLogWrapper *)dVar3,GVar2,1,pvVar5);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  dVar3 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,
             "GL_INVALID_OPERATION is generated if ctx.glUniform{1234}fv is used to load a uniform variable of type int, ivec2, ivec3, ivec4, unsigned int, uvec2, uvec3, uvec4."
             ,&local_431);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar3,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  dVar3 = program.m_program.m_info.linkTimeUs;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar3,dVar4);
  dVar3 = program.m_program.m_info.linkTimeUs;
  GVar2 = sampler_f;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3e0,0);
  glu::CallLogWrapper::glUniform4fv((CallLogWrapper *)dVar3,GVar2,1,pvVar5);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar3 = program.m_program.m_info.linkTimeUs;
  GVar2 = local_218;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3e0,0);
  glu::CallLogWrapper::glUniform4fv((CallLogWrapper *)dVar3,GVar2,1,pvVar5);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  dVar3 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,
             "GL_INVALID_OPERATION is generated if a sampler is loaded using a command other than ctx.glUniform1i and ctx.glUniform1iv."
             ,&local_459);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar3,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  dVar3 = program.m_program.m_info.linkTimeUs;
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar3,dVar4);
  dVar3 = program.m_program.m_info.linkTimeUs;
  location = local_21c;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3e0,0);
  glu::CallLogWrapper::glUniform1fv((CallLogWrapper *)dVar3,location,1,pvVar5);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)program.m_program.m_info.linkTimeUs,0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_3e0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void uniformfv_incompatible_type (NegativeTestContext& ctx)
{
	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(uniformTestVertSource, uniformTestFragSource));

	ctx.glUseProgram(program.getProgram());
	GLint vec4_v	= ctx.glGetUniformLocation(program.getProgram(), "vec4_v");	// vec4
	GLint ivec4_f	= ctx.glGetUniformLocation(program.getProgram(), "ivec4_f");	// ivec4
	GLint uvec4_f	= ctx.glGetUniformLocation(program.getProgram(), "uvec4_f");	// uvec4
	GLint sampler_f	= ctx.glGetUniformLocation(program.getProgram(), "sampler_f");	// sampler2D
	ctx.expectError(GL_NO_ERROR);

	if (vec4_v == -1 || ivec4_f == -1 || uvec4_f == -1 || sampler_f == -1)
	{
		ctx.getLog() << TestLog::Message << "// ERROR: Failed to retrieve uniform location" << TestLog::EndMessage;
		ctx.fail("Failed to retrieve uniform location");
	}

	std::vector<GLfloat> data(4);

	ctx.beginSection("GL_INVALID_OPERATION is generated if the size of the uniform variable declared in the shader does not match the size indicated by the ctx.glUniform command.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1fv(vec4_v, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2fv(vec4_v, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3fv(vec4_v, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4fv(vec4_v, 1, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if ctx.glUniform{1234}fv is used to load a uniform variable of type int, ivec2, ivec3, ivec4, unsigned int, uvec2, uvec3, uvec4.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform4fv(ivec4_f, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4fv(uvec4_f, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if a sampler is loaded using a command other than ctx.glUniform1i and ctx.glUniform1iv.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniform1fv(sampler_f, 1, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glUseProgram(0);
}